

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureClampTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::SparseTextureClampLookupColorTestCase::writeDataToTexture
          (SparseTextureClampLookupColorTestCase *this,Functions *gl,GLint target,GLint format,
          GLuint *texture,GLint level)

{
  glUseProgramFunc p_Var1;
  undefined *__s;
  undefined4 sample_00;
  GLint target_00;
  bool bVar2;
  int iVar3;
  int iVar4;
  deUint32 dVar5;
  GLenum GVar6;
  ostream *poVar7;
  TestError *this_00;
  uchar *ptr;
  GLchar *pGVar8;
  RenderContext *renderCtx;
  ShaderInfo *pSVar9;
  char *pcVar10;
  undefined1 local_440 [8];
  ShaderProgram program;
  undefined1 local_368 [4];
  GLint convFormat;
  undefined1 local_340 [8];
  ProgramSources sources;
  string local_250;
  allocator<char> local_229;
  string local_228;
  allocator<char> local_201;
  string local_200;
  undefined1 local_1e0 [8];
  TokenStrings s;
  undefined1 local_98 [8];
  string shader;
  GLint sample;
  GLubyte *data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vecData;
  GLuint local_48;
  GLint texSize;
  GLint depth;
  GLint height;
  GLint width;
  int local_2c;
  GLuint *pGStack_28;
  GLint level_local;
  GLuint *texture_local;
  GLint format_local;
  GLint target_local;
  Functions *gl_local;
  SparseTextureClampLookupColorTestCase *this_local;
  
  local_2c = level;
  pGStack_28 = texture;
  texture_local._0_4_ = format;
  texture_local._4_4_ = target;
  _format_local = gl;
  gl_local = (Functions *)this;
  poVar7 = std::operator<<((ostream *)
                           &(this->super_SparseTextureClampLookupResidencyTestCase).
                            super_SparseTexture2LookupTestCase.
                            super_SparseTexture2CommitmentTestCase.
                            super_SparseTextureCommitmentTestCase.field_0x88,
                           "Fill Texture with shader [level: ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_2c);
  std::operator<<(poVar7,"] - ");
  if ((this->super_SparseTextureClampLookupResidencyTestCase).super_SparseTexture2LookupTestCase.
      super_SparseTexture2CommitmentTestCase.super_SparseTextureCommitmentTestCase.mState.levels +
      -1 < local_2c) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid level",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
               ,0x2b0);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  SparseTextureUtils::getTextureLevelSize
            (texture_local._4_4_,
             &(this->super_SparseTextureClampLookupResidencyTestCase).
              super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
              super_SparseTextureCommitmentTestCase.mState,local_2c,&depth,&texSize,
             (GLint *)&local_48);
  if (((0 < depth) && (0 < texSize)) &&
     ((this->super_SparseTextureClampLookupResidencyTestCase).super_SparseTexture2LookupTestCase.
      super_SparseTexture2CommitmentTestCase.super_SparseTextureCommitmentTestCase.mState.minDepth
      <= (int)local_48)) {
    if (texture_local._4_4_ == 0x8513) {
      local_48 = local_48 * 6;
    }
    iVar3 = depth * texSize * local_48;
    iVar4 = tcu::TextureFormat::getPixelSize
                      (&(this->super_SparseTextureClampLookupResidencyTestCase).
                        super_SparseTexture2LookupTestCase.super_SparseTexture2CommitmentTestCase.
                        super_SparseTextureCommitmentTestCase.mState.format);
    vecData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = iVar3 * iVar4;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&data);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&data,
               (long)vecData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    ptr = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&data);
    ::deMemset(ptr,0xff,(long)vecData.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    for (shader.field_2._12_4_ = 0; __s = stc_compute_textureFill,
        (int)shader.field_2._12_4_ <
        (this->super_SparseTextureClampLookupResidencyTestCase).super_SparseTexture2LookupTestCase.
        super_SparseTexture2CommitmentTestCase.super_SparseTextureCommitmentTestCase.mState.samples;
        shader.field_2._12_4_ = shader.field_2._12_4_ + 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_98,__s,(allocator<char> *)(s.sampleDef.field_2._M_local_buf + 0xf))
      ;
      std::allocator<char>::~allocator((allocator<char> *)(s.sampleDef.field_2._M_local_buf + 0xf));
      target_00 = texture_local._4_4_;
      GVar6 = (GLenum)texture_local;
      sample_00 = shader.field_2._12_4_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,"image",&local_201);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"image",&local_229);
      SparseTexture2CommitmentTestCase::createShaderTokens
                ((TokenStrings *)local_1e0,(SparseTexture2CommitmentTestCase *)this,target_00,GVar6,
                 sample_00,&local_200,&local_228);
      std::__cxx11::string::~string((string *)&local_228);
      std::allocator<char>::~allocator(&local_229);
      std::__cxx11::string::~string((string *)&local_200);
      std::allocator<char>::~allocator(&local_201);
      std::__cxx11::string::string
                ((string *)&sources.separable,(string *)(s.inputType.field_2._M_local_buf + 8));
      generateExpectedResult(&local_250,this,(string *)&sources.separable,local_2c);
      std::__cxx11::string::operator=
                ((string *)(s.returnType.field_2._M_local_buf + 8),(string *)&local_250);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&sources.separable);
      pGVar8 = (GLchar *)std::__cxx11::string::c_str();
      replaceToken("<INPUT_TYPE>",pGVar8,(string *)local_98);
      pGVar8 = (GLchar *)std::__cxx11::string::c_str();
      replaceToken("<POINT_TYPE>",pGVar8,(string *)local_98);
      pGVar8 = (GLchar *)std::__cxx11::string::c_str();
      replaceToken("<POINT_DEF>",pGVar8,(string *)local_98);
      pGVar8 = (GLchar *)std::__cxx11::string::c_str();
      replaceToken("<RETURN_TYPE>",pGVar8,(string *)local_98);
      pGVar8 = (GLchar *)std::__cxx11::string::c_str();
      replaceToken("<RESULT_EXPECTED>",pGVar8,(string *)local_98);
      pGVar8 = (GLchar *)std::__cxx11::string::c_str();
      replaceToken("<SAMPLE_DEF>",pGVar8,(string *)local_98);
      glu::ProgramSources::ProgramSources((ProgramSources *)local_340);
      glu::ComputeSource::ComputeSource((ComputeSource *)local_368,(string *)local_98);
      glu::ProgramSources::operator<<((ProgramSources *)local_340,(ShaderSource *)local_368);
      glu::ComputeSource::~ComputeSource((ComputeSource *)local_368);
      program.m_program.m_info.linkTimeUs._4_4_ = (GLenum)texture_local;
      if ((GLenum)texture_local == 0x81a5) {
        program.m_program.m_info.linkTimeUs._4_4_ = 0x822a;
      }
      renderCtx = deqp::Context::getRenderContext
                            ((this->super_SparseTextureClampLookupResidencyTestCase).
                             super_SparseTexture2LookupTestCase.
                             super_SparseTexture2CommitmentTestCase.
                             super_SparseTextureCommitmentTestCase.super_TestCase.m_context);
      glu::ShaderProgram::ShaderProgram
                ((ShaderProgram *)local_440,renderCtx,(ProgramSources *)local_340);
      bVar2 = glu::ShaderProgram::isOk((ShaderProgram *)local_440);
      if (bVar2) {
        p_Var1 = _format_local->useProgram;
        dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)local_440);
        (*p_Var1)(dVar5);
        GVar6 = (*_format_local->getError)();
        glu::checkError(GVar6,"glUseProgram",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                        ,0x2e1);
        (*_format_local->bindImageTexture)
                  (0,*pGStack_28,local_2c,'\0',0,0x88b9,program.m_program.m_info.linkTimeUs._4_4_);
        GVar6 = (*_format_local->getError)();
        glu::checkError(GVar6,"glBindImageTexture",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                        ,0x2e4);
        (*_format_local->uniform1i)(1,0);
        GVar6 = (*_format_local->getError)();
        glu::checkError(GVar6,"glUniform1i",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                        ,0x2e6);
        (*_format_local->dispatchCompute)(depth,texSize,local_48);
        GVar6 = (*_format_local->getError)();
        glu::checkError(GVar6,"glDispatchCompute",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                        ,0x2e8);
        (*_format_local->memoryBarrier)(0xffffffff);
        GVar6 = (*_format_local->getError)();
        glu::checkError(GVar6,"glMemoryBarrier",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureClampTests.cpp"
                        ,0x2ea);
      }
      else {
        poVar7 = std::operator<<((ostream *)
                                 &(this->super_SparseTextureClampLookupResidencyTestCase).
                                  super_SparseTexture2LookupTestCase.
                                  super_SparseTexture2CommitmentTestCase.
                                  super_SparseTextureCommitmentTestCase.field_0x88,
                                 "Compute shader compilation failed (writing) for target: ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,texture_local._4_4_);
        poVar7 = std::operator<<(poVar7,", format: ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,(GLenum)texture_local);
        poVar7 = std::operator<<(poVar7,", sample: ");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,shader.field_2._12_4_);
        poVar7 = std::operator<<(poVar7,", infoLog: ");
        pSVar9 = glu::ShaderProgram::getShaderInfo((ShaderProgram *)local_440,SHADERTYPE_COMPUTE,0);
        poVar7 = std::operator<<(poVar7,(string *)&pSVar9->infoLog);
        poVar7 = std::operator<<(poVar7,", shaderSource: ");
        pcVar10 = (char *)std::__cxx11::string::c_str();
        poVar7 = std::operator<<(poVar7,pcVar10);
        std::operator<<(poVar7," - ");
      }
      glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_440);
      glu::ProgramSources::~ProgramSources((ProgramSources *)local_340);
      SparseTexture2CommitmentTestCase::TokenStrings::~TokenStrings((TokenStrings *)local_1e0);
      std::__cxx11::string::~string((string *)local_98);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&data);
  }
  return true;
}

Assistant:

bool SparseTextureClampLookupColorTestCase::writeDataToTexture(const Functions& gl, GLint target, GLint format,
															   GLuint& texture, GLint level)
{
	mLog << "Fill Texture with shader [level: " << level << "] - ";

	if (level > mState.levels - 1)
		TCU_FAIL("Invalid level");

	GLint width;
	GLint height;
	GLint depth;
	SparseTextureUtils::getTextureLevelSize(target, mState, level, width, height, depth);

	if (width > 0 && height > 0 && depth >= mState.minDepth)
	{
		if (target == GL_TEXTURE_CUBE_MAP)
			depth = depth * 6;

		GLint texSize = width * height * depth * mState.format.getPixelSize();

		std::vector<GLubyte> vecData;
		vecData.resize(texSize);
		GLubyte* data = vecData.data();

		deMemset(data, 255, texSize);

		for (GLint sample = 0; sample < mState.samples; ++sample)
		{
			std::string shader = stc_compute_textureFill;

			// Adjust shader source to texture format
			TokenStrings s = createShaderTokens(target, format, sample);

			// Change expected result as it has to be adjusted to different levels
			s.resultExpected = generateExpectedResult(s.returnType, level);

			replaceToken("<INPUT_TYPE>", s.inputType.c_str(), shader);
			replaceToken("<POINT_TYPE>", s.pointType.c_str(), shader);
			replaceToken("<POINT_DEF>", s.pointDef.c_str(), shader);
			replaceToken("<RETURN_TYPE>", s.returnType.c_str(), shader);
			replaceToken("<RESULT_EXPECTED>", s.resultExpected.c_str(), shader);
			replaceToken("<SAMPLE_DEF>", s.sampleDef.c_str(), shader);

			ProgramSources sources;
			sources << ComputeSource(shader);

			GLint convFormat = format;
			if (format == GL_DEPTH_COMPONENT16)
				convFormat = GL_R16;

			// Build and run shader
			ShaderProgram program(m_context.getRenderContext(), sources);
			if (program.isOk())
			{
				gl.useProgram(program.getProgram());
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram");
				gl.bindImageTexture(0 /* unit */, texture, level /* level */, GL_FALSE /* layered */, 0 /* layer */,
									GL_WRITE_ONLY, convFormat);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBindImageTexture");
				gl.uniform1i(1, 0 /* image_unit */);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i");
				gl.dispatchCompute(width, height, depth);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glDispatchCompute");
				gl.memoryBarrier(GL_ALL_BARRIER_BITS);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glMemoryBarrier");
			}
			else
			{
				mLog << "Compute shader compilation failed (writing) for target: " << target << ", format: " << format
					 << ", sample: " << sample << ", infoLog: " << program.getShaderInfo(SHADERTYPE_COMPUTE).infoLog
					 << ", shaderSource: " << shader.c_str() << " - ";
			}
		}
	}

	return true;
}